

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_store_fcr(DisasContext_conflict2 *s,TCGv_i32 val,int reg)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGTemp *local_18;
  TCGv_i32 local_10;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (reg == 4) {
    local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_10 = val + (long)tcg_ctx;
    tcg_gen_callN_m68k(tcg_ctx,helper_set_fpcr_m68k,(TCGTemp *)0x0,2,&local_18);
  }
  else if (reg == 2) {
    tcg_gen_st_i32(tcg_ctx,val,tcg_ctx->cpu_env,0x104);
    return;
  }
  return;
}

Assistant:

static void gen_store_fcr(DisasContext *s, TCGv val, int reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    switch (reg) {
    case M68K_FPIAR:
        break;
    case M68K_FPSR:
        tcg_gen_st_i32(tcg_ctx, val, tcg_ctx->cpu_env, offsetof(CPUM68KState, fpsr));
        break;
    case M68K_FPCR:
        gen_helper_set_fpcr(tcg_ctx, tcg_ctx->cpu_env, val);
        break;
    }
}